

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O2

endpoint *
libtorrent::aux::parse_endpoint(endpoint *__return_storage_ptr__,string_view str,error_code *ec)

{
  error_code_enum val;
  int iVar1;
  size_type sVar2;
  error_code *in_R8;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view str_01;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string_view local_78;
  anon_union_16_3_a3f0114d_for___in6_u local_68;
  unsigned_long local_58;
  char *local_50;
  anon_union_16_3_a3f0114d_for___in6_u local_48;
  unsigned_long local_38;
  
  str_00._M_str = str._M_str;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x10) = 0;
  (__return_storage_ptr__->impl_).data_.v6.sin6_scope_id = 0;
  *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 2;
  str_00._M_len = (size_t)str_00._M_str;
  local_78 = trim((libtorrent *)str._M_len,str_00);
  local_88 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
  if (local_78._M_len != 0) {
    if (*local_78._M_str == '[') {
      sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_78,']',0);
      if (sVar2 == 0xffffffffffffffff) {
        val = expected_close_bracket_in_address;
        goto LAB_002c0be0;
      }
      bVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_78,1,sVar2 - 1)
      ;
      str_01._M_len = bVar3._M_str;
      local_88 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_78,sVar2 + 1,0xffffffffffffffff);
      if ((local_88._M_len != 0) && (*local_88._M_str == ':')) {
        local_88 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&local_88,1,0xffffffffffffffff);
        str_01._M_str = (char *)ec;
        boost::asio::ip::make_address_v6((address_v6 *)&local_68,(ip *)bVar3._M_len,str_01,in_R8);
        local_50 = (char *)0x1;
        local_48._0_8_ = CONCAT44(local_68.__u6_addr32[1],local_68.__u6_addr32[0]);
        local_48._8_8_ = local_68._8_8_;
        local_38 = local_58;
        goto LAB_002c0b92;
      }
    }
    else {
      sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_78,':',0);
      if (sVar2 != 0xffffffffffffffff) {
        bVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_78,0,sVar2);
        local_88 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&local_78,sVar2 + 1,0xffffffffffffffff);
        boost::asio::ip::make_address_v4((ip *)local_68.__u6_addr8,bVar3,ec);
        local_50 = (char *)((ulong)local_68.__u6_addr32[0] << 0x20);
        local_48._0_8_ = 0;
        local_48._8_8_ = 0;
        local_38 = 0;
LAB_002c0b92:
        boost::asio::ip::detail::endpoint::address
                  (&__return_storage_ptr__->impl_,(address *)&local_50);
        if (ec->failed_ != false) {
          return __return_storage_ptr__;
        }
        if (local_88._M_len != 0) {
          ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&local_50,&local_88,(allocator<char> *)local_68.__u6_addr8);
          iVar1 = atoi(local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          if (0xffff0000 < iVar1 - 0x10000U) {
            (__return_storage_ptr__->impl_).data_.v4.sin_port =
                 (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
            return __return_storage_ptr__;
          }
        }
      }
    }
  }
  val = invalid_port;
LAB_002c0be0:
  boost::system::error_code::operator=(ec,val);
  return __return_storage_ptr__;
}

Assistant:

tcp::endpoint parse_endpoint(string_view str, error_code& ec)
	{
		tcp::endpoint ret;

		str = trim(str);

		string_view addr;
		string_view port;

		if (str.empty())
		{
			ec = errors::invalid_port;
			return ret;
		}

		// this is for IPv6 addresses
		if (str.front() == '[')
		{
			auto const close_bracket = str.find_first_of(']');
			if (close_bracket == string_view::npos)
			{
				ec = errors::expected_close_bracket_in_address;
				return ret;
			}
			addr = str.substr(1, close_bracket - 1);
			port = str.substr(close_bracket + 1);
			if (port.empty() || port.front() != ':')
			{
				ec = errors::invalid_port;
				return ret;
			}
			// shave off the ':'
			port = port.substr(1);
			ret.address(make_address_v6(addr, ec));
			if (ec) return ret;
		}
		else
		{
			auto const port_pos = str.find_first_of(':');
			if (port_pos == string_view::npos)
			{
				ec = errors::invalid_port;
				return ret;
			}
			addr = str.substr(0, port_pos);
			port = str.substr(port_pos + 1);
			ret.address(make_address_v4(addr, ec));
			if (ec) return ret;
		}

		if (port.empty())
		{
			ec = errors::invalid_port;
			return ret;
		}

		int const port_num = std::atoi(std::string(port).c_str());
		if (port_num <= 0 || port_num > std::numeric_limits<std::uint16_t>::max())
		{
			ec = errors::invalid_port;
			return ret;
		}
		ret.port(static_cast<std::uint16_t>(port_num));
		return ret;
	}